

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O0

size_t TestSuite::_msg(char *format,...)

{
  char in_AL;
  int iVar1;
  TestSuite **ppTVar2;
  bool *pbVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  char *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  TestSuite *cur_test;
  size_t cur_len;
  undefined1 auStack_e8 [8];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined4 local_38;
  undefined4 local_34;
  undefined1 *local_30;
  undefined1 *local_28;
  TestSuite *local_18;
  size_t local_10;
  char *local_8;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_10 = 0;
  local_e0 = in_RSI;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  local_8 = in_RDI;
  ppTVar2 = getCurTest();
  local_18 = *ppTVar2;
  if (((local_18 == (TestSuite *)0x0) ||
      (((((local_18->options).printTestMessage & 1U) == 0 && ((local_18->displayMsg & 1U) == 0)) ||
       ((local_18->suppressMsg & 1U) != 0)))) && (pbVar3 = globalMsgFlag(), (*pbVar3 & 1U) == 0)) {
    return local_10;
  }
  local_30 = &stack0x00000008;
  local_34 = 0x30;
  local_38 = 8;
  local_28 = auStack_e8;
  iVar1 = vprintf(local_8,&local_38);
  return (long)iVar1 + local_10;
}

Assistant:

static size_t _msg(const char* format, ...) {
        size_t cur_len = 0;
        TestSuite* cur_test = TestSuite::getCurTest();
        if ( ( cur_test &&
               (cur_test->options.printTestMessage || cur_test->displayMsg) &&
               !cur_test->suppressMsg ) ||
             globalMsgFlag() ) {
            va_list args;
            va_start(args, format);
            cur_len += vprintf(format, args);
            va_end(args);
        }
        return cur_len;
    }